

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

void Curl_ntlm_core_lm_resp(uchar *keys,uchar *plaintext,uchar *results)

{
  undefined1 local_a0 [8];
  DES_key_schedule ks;
  uchar *results_local;
  uchar *plaintext_local;
  uchar *keys_local;
  
  ks.ks[0xf] = (anon_union_8_2_85ee1207)results;
  setup_des_key(keys,(DES_key_schedule *)local_a0);
  DES_ecb_encrypt((const_DES_cblock *)plaintext,(DES_cblock *)ks.ks[0xf],
                  (DES_key_schedule *)local_a0,1);
  setup_des_key(keys + 7,(DES_key_schedule *)local_a0);
  DES_ecb_encrypt((const_DES_cblock *)plaintext,(DES_cblock *)((long)ks.ks[0xf] + 8),
                  (DES_key_schedule *)local_a0,1);
  setup_des_key(keys + 0xe,(DES_key_schedule *)local_a0);
  DES_ecb_encrypt((const_DES_cblock *)plaintext,(DES_cblock *)((long)ks.ks[0xf] + 0x10),
                  (DES_key_schedule *)local_a0,1);
  return;
}

Assistant:

void Curl_ntlm_core_lm_resp(const unsigned char *keys,
                            const unsigned char *plaintext,
                            unsigned char *results)
{
#if defined(USE_OPENSSL_DES) || defined(USE_WOLFSSL)
  DES_key_schedule ks;

  setup_des_key(keys, DESKEY(ks));
  DES_ecb_encrypt((DES_cblock*) plaintext, (DES_cblock*) results,
                  DESKEY(ks), DES_ENCRYPT);

  setup_des_key(keys + 7, DESKEY(ks));
  DES_ecb_encrypt((DES_cblock*) plaintext, (DES_cblock*) (results + 8),
                  DESKEY(ks), DES_ENCRYPT);

  setup_des_key(keys + 14, DESKEY(ks));
  DES_ecb_encrypt((DES_cblock*) plaintext, (DES_cblock*) (results + 16),
                  DESKEY(ks), DES_ENCRYPT);
#elif defined(USE_GNUTLS)
  struct des_ctx des;
  setup_des_key(keys, &des);
  des_encrypt(&des, 8, results, plaintext);
  setup_des_key(keys + 7, &des);
  des_encrypt(&des, 8, results + 8, plaintext);
  setup_des_key(keys + 14, &des);
  des_encrypt(&des, 8, results + 16, plaintext);
#elif defined(USE_MBEDTLS) || defined(USE_SECTRANSP)            \
  || defined(USE_OS400CRYPTO) || defined(USE_WIN32_CRYPTO)
  encrypt_des(plaintext, results, keys);
  encrypt_des(plaintext, results + 8, keys + 7);
  encrypt_des(plaintext, results + 16, keys + 14);
#else
  (void)keys;
  (void)plaintext;
  (void)results;
#endif
}